

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

void __thiscall Arbitraryint::~Arbitraryint(Arbitraryint *this)

{
  testinator::Test::~Test(&this->super_Test);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(int, Arbitrary)
{
  testinator::Arbitrary<int> a;
  int v = a.generate(0,0);
  a.shrink(v);
  return true;
}